

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bias_x86_avx2.cpp
# Opt level: O3

int __thiscall
ncnn::Bias_x86_avx2::forward_inplace(Bias_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  long lVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  uint uVar7;
  long lVar8;
  undefined1 (*pauVar9) [32];
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  undefined1 auVar14 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  
  iVar2 = bottom_top_blob->c;
  if (0 < (long)iVar2) {
    uVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    lVar3 = *(long *)(&this->field_0xd8 + (long)this->_vptr_Bias_x86_avx2[-3]);
    lVar8 = 0;
    auVar5 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar6 = vpmovsxbq_avx2(ZEXT416(0x7060504));
    auVar14._8_8_ = 0x8000000000000000;
    auVar14._0_8_ = 0x8000000000000000;
    auVar14._16_8_ = 0x8000000000000000;
    auVar14._24_8_ = 0x8000000000000000;
    auVar4 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
    do {
      pauVar9 = (undefined1 (*) [32])
                (bottom_top_blob->cstep * lVar8 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      fVar1 = *(float *)(lVar3 + lVar8 * 4);
      if ((int)uVar7 < 8) {
        uVar12 = 0;
      }
      else {
        iVar10 = 7;
        do {
          auVar15._0_4_ = fVar1 + *(float *)*pauVar9;
          auVar15._4_4_ = fVar1 + *(float *)((long)*pauVar9 + 4);
          auVar15._8_4_ = fVar1 + *(float *)((long)*pauVar9 + 8);
          auVar15._12_4_ = fVar1 + *(float *)((long)*pauVar9 + 0xc);
          auVar15._16_4_ = fVar1 + *(float *)((long)*pauVar9 + 0x10);
          auVar15._20_4_ = fVar1 + *(float *)((long)*pauVar9 + 0x14);
          auVar15._24_4_ = fVar1 + *(float *)((long)*pauVar9 + 0x18);
          auVar15._28_4_ = fVar1 + *(float *)((long)*pauVar9 + 0x1c);
          *pauVar9 = auVar15;
          pauVar9 = pauVar9 + 1;
          iVar10 = iVar10 + 8;
          uVar12 = uVar7 & 0xfffffff8;
        } while (iVar10 < (int)uVar7);
      }
      uVar11 = uVar12 | 3;
      while ((int)uVar11 < (int)uVar7) {
        auVar17._0_4_ = fVar1 + *(float *)*pauVar9;
        auVar17._4_4_ = fVar1 + *(float *)((long)*pauVar9 + 4);
        auVar17._8_4_ = fVar1 + *(float *)((long)*pauVar9 + 8);
        auVar17._12_4_ = fVar1 + *(float *)((long)*pauVar9 + 0xc);
        *(undefined1 (*) [16])*pauVar9 = auVar17;
        pauVar9 = (undefined1 (*) [32])((long)*pauVar9 + 0x10);
        uVar11 = uVar12 + 7;
        uVar12 = uVar12 + 4;
      }
      if ((int)uVar12 < (int)uVar7) {
        uVar12 = ~uVar12 + uVar7;
        auVar16._8_4_ = uVar12;
        auVar16._0_8_ = CONCAT44(0,uVar12);
        auVar16._12_4_ = 0;
        auVar16._16_4_ = uVar12;
        auVar16._20_4_ = 0;
        auVar16._24_4_ = uVar12;
        auVar16._28_4_ = 0;
        auVar15 = vpor_avx2(auVar16,auVar14);
        uVar13 = 0;
        do {
          auVar18._8_8_ = uVar13;
          auVar18._0_8_ = uVar13;
          auVar18._16_8_ = uVar13;
          auVar18._24_8_ = uVar13;
          auVar19 = vpor_avx2(auVar18,auVar5);
          auVar16 = vpor_avx2(auVar18,auVar6);
          auVar16 = vpcmpgtq_avx2(auVar16 ^ auVar14,auVar15);
          auVar19 = vpcmpgtq_avx2(auVar19 ^ auVar14,auVar15);
          auVar16 = vpackssdw_avx2(auVar19,auVar16);
          auVar17 = vpackssdw_avx(SUB3216(auVar16 ^ auVar4,0),SUB3216(auVar16 ^ auVar4,0x10));
          auVar17 = vpshufd_avx(auVar17,0xd8);
          auVar16 = vpmovzxwd_avx2(auVar17);
          auVar19 = vpslld_avx2(auVar16,0x1f);
          auVar16 = vmaskmovps_avx(auVar19,*(undefined1 (*) [32])((long)*pauVar9 + uVar13 * 4));
          auVar20._0_4_ = auVar16._0_4_ + fVar1;
          auVar20._4_4_ = auVar16._4_4_ + fVar1;
          auVar20._8_4_ = auVar16._8_4_ + fVar1;
          auVar20._12_4_ = auVar16._12_4_ + fVar1;
          auVar20._16_4_ = auVar16._16_4_ + fVar1;
          auVar20._20_4_ = auVar16._20_4_ + fVar1;
          auVar20._24_4_ = auVar16._24_4_ + fVar1;
          auVar20._28_4_ = auVar16._28_4_ + fVar1;
          auVar16 = vmaskmovps_avx(auVar19,auVar20);
          *(undefined1 (*) [32])((long)*pauVar9 + uVar13 * 4) = auVar16;
          uVar13 = uVar13 + 8;
        } while ((CONCAT44(0,uVar12) + 8 & 0xfffffffffffffff8) != uVar13);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar2);
  }
  return 0;
}

Assistant:

int Bias_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    const float* bias_ptr = bias_data;
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        float bias = bias_ptr[q];

        int i = 0;
#if __SSE2__
#if __AVX__
        {
            __m256 _bias256 = _mm256_set1_ps(bias);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _outp = _mm256_add_ps(_p, _bias256);
                _mm256_storeu_ps(ptr, _outp);

                ptr += 8;
            }
        }
#endif // __AVX__
        {
            __m128 _bias = _mm_set1_ps(bias);
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _outp = _mm_add_ps(_p, _bias);
                _mm_storeu_ps(ptr, _outp);

                ptr += 4;
            }
        }
#endif // __SSE2__

        for (; i < size; i++)
        {
            *ptr = *ptr + bias;

            ptr++;
        }
    }

    return 0;
}